

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions.h
# Opt level: O0

void __thiscall QOpenGLFunctions::glClear(QOpenGLFunctions *this,GLbitfield mask)

{
  undefined4 in_ESI;
  long *in_RDI;
  
  (**(code **)(*in_RDI + 0x10))(in_ESI);
  return;
}

Assistant:

inline void QOpenGLFunctions::glClear(GLbitfield mask)
{
#if QT_CONFIG(opengles2) && defined(Q_OS_ANDROID)
    ::glClear(mask);
#else
    Q_ASSERT(QOpenGLFunctions::isInitialized(d_ptr));
    d_ptr->f.Clear(mask);
#endif
    Q_OPENGL_FUNCTIONS_DEBUG
}